

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O1

int tcv_get_om4_copper_length(tcv_t *tcv)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -4;
  if ((tcv != (tcv_t *)0x0) && (tcv->created == true)) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&tcv->lock);
    if (iVar1 == 0) {
      iVar2 = -0xd;
      if (((tcv != (tcv_t *)0x0) && (tcv->created == true)) && (tcv->initialized == true)) {
        iVar2 = (*tcv->fun->get_om4_copper_length)(tcv);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
    }
  }
  return iVar2;
}

Assistant:

int tcv_get_om4_copper_length(tcv_t *tcv)
{
	int ret = TCV_ERR_NOT_INITIALIZED;

	if (!tcv_check_and_lock_ok(tcv))
		return TCV_ERR_INVALID_ARG;

	if (tcv_is_initialized(tcv)) {
		ret = tcv->fun->get_om4_copper_length(tcv);
	}

	tcv_unlock(tcv);
	return ret;
}